

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicsObject.cpp
# Opt level: O3

uint32 Js::AtomicsObject::ValidateAtomicAccess
                 (Var typedArray,Var requestIndex,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  TypedArrayBase *pTVar6;
  double dVar7;
  
  bVar2 = VarIs<Js::TypedArrayBase>(typedArray);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0x38,"(VarIs<TypedArrayBase>(typedArray))",
                                "VarIs<TypedArrayBase>(typedArray)");
    if (!bVar2) goto LAB_00b23ba1;
    *puVar5 = 0;
  }
  if (((ulong)requestIndex & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)requestIndex & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)requestIndex & 0xffff000000000000) == 0x1000000000000) goto LAB_00b23ad6;
    BVar3 = JavascriptOperators::IsUndefined(requestIndex);
    uVar4 = 0;
    if (BVar3 == 0) {
      uVar4 = JavascriptConversion::ToInt32_Full(requestIndex,scriptContext);
      dVar7 = JavascriptConversion::ToInteger_Full(requestIndex,scriptContext);
      if ((dVar7 != (double)(int)uVar4) || (NAN(dVar7) || NAN((double)(int)uVar4)))
      goto LAB_00b23b91;
      goto LAB_00b23b30;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b23ba1;
    *puVar5 = 0;
LAB_00b23ad6:
    if (((ulong)requestIndex & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) {
LAB_00b23ba1:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    uVar4 = (uint32)requestIndex;
LAB_00b23b30:
    if ((int)uVar4 < 0) goto LAB_00b23b91;
  }
  pTVar6 = VarTo<Js::TypedArrayBase>(typedArray);
  if ((int)uVar4 < (int)(pTVar6->super_ArrayBufferParent).super_ArrayObject.length) {
    return uVar4;
  }
LAB_00b23b91:
  JavascriptError::ThrowRangeError(scriptContext,-0x7ff5e9e1,(PCWSTR)0x0);
}

Assistant:

uint32 AtomicsObject::ValidateAtomicAccess(Var typedArray, Var requestIndex, ScriptContext *scriptContext)
    {
        Assert(VarIs<TypedArrayBase>(typedArray));

        int32 accessIndex = -1;
        if (TaggedInt::Is(requestIndex))
        {
            accessIndex = TaggedInt::ToInt32(requestIndex);
        }
        else if(Js::JavascriptOperators::IsUndefined(requestIndex))
        {
            accessIndex = 0;
        }
        else
        {
            accessIndex = JavascriptConversion::ToInt32_Full(requestIndex, scriptContext);
            double dblValue = JavascriptConversion::ToInteger(requestIndex, scriptContext);
            if (dblValue != accessIndex)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_InvalidTypedArrayIndex);
            }
        }

        if (accessIndex < 0 || accessIndex >= (int32)VarTo<TypedArrayBase>(typedArray)->GetLength())
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_InvalidTypedArrayIndex);
        }

        return (uint32)accessIndex;
    }